

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.cpp
# Opt level: O2

LIndex __thiscall
JPolComponent_VectorImplementation::GetIndex(JPolComponent_VectorImplementation *this)

{
  uint uVar1;
  LIndex LVar2;
  Interface_ProblemToPolicyDiscretePure *pIVar3;
  long lVar4;
  ulong uVar5;
  allocator_type local_89;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> individualIndices;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrIndPol;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> indexVec;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> nrElems;
  
  pIVar3 = this->_m_PTPDP;
  if (pIVar3 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
    pIVar3 = (this->_m_PTPDPshared).px;
  }
  uVar1 = (*(pIVar3->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&nrElems,2,(allocator_type *)&indexVec);
  lVar4 = 1;
  *nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 1;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&indexVec,2,(allocator_type *)&nrIndPol);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&nrIndPol,(long)(int)uVar1,(allocator_type *)&individualIndices);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&individualIndices,(long)(int)uVar1,&local_89);
  for (uVar5 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar5; uVar5 = uVar5 + 1) {
    pIVar3 = this->_m_PTPDP;
    if (pIVar3 == (Interface_ProblemToPolicyDiscretePure *)0x0) {
      pIVar3 = (this->_m_PTPDPshared).px;
    }
    LVar2 = Interface_ProblemToPolicyDiscretePure::GetNrPolicies
                      (pIVar3,(Index)uVar5,this->_m_idc,
                       ((this->_m_indivPols_PolicyPureVector).
                        super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar5]->super_PolicyDiscretePure).
                       super_PolicyDiscrete.super_Policy._m_depth);
    nrIndPol.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar5] = LVar2;
    LVar2 = PolicyPureVector::GetIndex
                      ((this->_m_indivPols_PolicyPureVector).
                       super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar5]);
    individualIndices.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar5] = LVar2;
  }
  LVar2 = *individualIndices.
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; lVar4 < (int)uVar1; lVar4 = lVar4 + 1) {
    *nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
     super__Vector_impl_data._M_start =
         *nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
          _M_impl.super__Vector_impl_data._M_start *
         nrIndPol.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
         _M_impl.super__Vector_impl_data._M_start[lVar4 + -1];
    nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] =
         nrIndPol.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
         _M_impl.super__Vector_impl_data._M_start[lVar4];
    *indexVec.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
     super__Vector_impl_data._M_start = LVar2;
    indexVec.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] =
         individualIndices.
         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
         super__Vector_impl_data._M_start[lVar4];
    LVar2 = IndexTools::IndividualToJointIndices(&indexVec,&nrElems);
  }
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&individualIndices.
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&nrIndPol.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&indexVec.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
            (&nrElems.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
  return LVar2;
}

Assistant:

LIndex JPolComponent_VectorImplementation::GetIndex() const
{
    int nrAgents=GetInterfacePTPDiscretePure()->GetNrAgents();

    vector<LIndex> nrElems(2);
    nrElems[0]=1;
    nrElems[1]=1;

    vector<LIndex> indexVec(2);

    vector<LIndex> nrIndPol(nrAgents);
    vector<LIndex> individualIndices(nrAgents);
    for(int k=0;k<nrAgents;++k)
    {
        nrIndPol[k]=GetInterfacePTPDiscretePure()->GetNrPolicies(k, _m_idc,
                                            _m_indivPols_PolicyPureVector[k]->
                                            GetDepth());
        individualIndices[k]=_m_indivPols_PolicyPureVector[k]->GetIndex();
    }

    LIndex i=individualIndices[0];

    for(int k=1;k<nrAgents;++k)
    {
        
        nrElems[0]*=nrIndPol[k-1];
        nrElems[1]=nrIndPol[k];

        indexVec[0]=i;
        indexVec[1]=individualIndices[k];
        i=IndexTools::IndividualToJointIndices(indexVec,nrElems);
#if 0
        cout << SoftPrintVector(nrIndPol) << " "
             << SoftPrintVector(individualIndices)
             << " " << k << " "
             << SoftPrintVector(indexVec) << " "
             << SoftPrintVector(nrElems) << endl;
#endif
    }
    return(i);
}